

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

Solution * calculate_one_solution(Solution *__return_storage_ptr__,int argc,Edge *edges,int maxNode)

{
  long lVar1;
  int iVar2;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  Solution *local_60;
  Solution *local_58;
  undefined1 *local_50;
  int local_40;
  int local_3c;
  int i_1;
  int NumberColorConflicts;
  int num;
  int i;
  unsigned_long __vla_expr0;
  int local_1c;
  Edge *pEStack_18;
  int maxNode_local;
  Edge *edges_local;
  int argc_local;
  
  __vla_expr0 = (unsigned_long)auStack_68;
  _num = (ulong)(uint)maxNode;
  lVar1 = -(_num * 4 + 0xf & 0xfffffffffffffff0);
  local_50 = auStack_68 + lVar1;
  local_60 = __return_storage_ptr__;
  local_58 = __return_storage_ptr__;
  local_1c = maxNode;
  pEStack_18 = edges;
  edges_local._4_4_ = argc;
  for (NumberColorConflicts = 0; NumberColorConflicts < local_1c;
      NumberColorConflicts = NumberColorConflicts + 1) {
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x101635;
    iVar2 = rand();
    iVar2 = iVar2 % 3 + 1;
    *(int *)(local_50 + (long)NumberColorConflicts * 4) = iVar2;
    i_1 = iVar2;
  }
  local_3c = 0;
  local_40 = 0;
  do {
    if (edges_local._4_4_ + -1 <= local_40) {
      local_60->amount = local_3c;
      return local_58;
    }
    if (*(int *)(local_50 + (long)pEStack_18[local_40].start * 4) ==
        *(int *)(local_50 + (long)pEStack_18[local_40].end * 4)) {
      if (7 < local_3c) {
        local_60->amount = -1;
        return local_58;
      }
      local_60->edges[local_3c] = pEStack_18[local_40];
      local_3c = local_3c + 1;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

static Solution calculate_one_solution(const int argc, const Edge *edges, const int maxNode)
{
	Solution newSolution;

	int node_color[maxNode];
	for (int i = 0; i < maxNode; i++)
	{
		int num = (rand() % (3)) + 1;
		node_color[i] = num;
	}

	int NumberColorConflicts = 0;
	for (int i = 0; i < argc - 1; i++)
	{
		if (node_color[edges[i].start] == node_color[edges[i].end])
		{
			if (NumberColorConflicts >= MAXRETURN)	// if to many conflicts are found
			{
				newSolution.amount = -1;	// indicates that to many are found
				return newSolution;
			}
			newSolution.edges[NumberColorConflicts] = edges[i];
			NumberColorConflicts++;
		}
	}
	newSolution.amount = NumberColorConflicts;
	return newSolution;
}